

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  String SStack_38;
  
  switch(other) {
  case nullValue:
    bVar2 = *(byte *)&this->bits_;
    if (bVar2 - 1 < 3) {
      dVar5 = asDouble(this);
      bVar3 = 1;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) break;
      bVar2 = *(byte *)&this->bits_;
    }
    if (bVar2 == 4) {
      asString_abi_cxx11_(&SStack_38,this);
      if (SStack_38._M_string_length != 0) {
        bVar2 = *(byte *)&this->bits_;
        bVar4 = true;
        goto LAB_00129411;
      }
      bVar3 = true;
    }
    else {
      if ((bVar2 == 5) && (bVar3 = 1, (this->value_).bool_ == false)) break;
      bVar4 = false;
LAB_00129411:
      if (((bVar2 == 7) || (bVar2 == 6)) &&
         ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar3 = true;
      }
      else {
        bVar3 = bVar2 == 0;
      }
      if (!bVar4) break;
    }
    std::__cxx11::string::~string((string *)&SStack_38);
    break;
  case intValue:
    bVar4 = isInt(this);
    bVar3 = 1;
    if ((bVar4) || (cVar1 = (char)*(undefined2 *)&this->bits_, cVar1 == '\x05')) break;
    if ((cVar1 == '\x03') && (dVar5 = (this->value_).real_, -2147483648.0 <= dVar5)) {
      dVar6 = 2147483647.0;
LAB_001293a2:
      bVar3 = 1;
      if (dVar5 <= dVar6) break;
    }
    goto LAB_001293a8;
  case uintValue:
    bVar4 = isUInt(this);
    bVar3 = 1;
    if ((bVar4) || (cVar1 = (char)*(undefined2 *)&this->bits_, cVar1 == '\x05')) break;
    if ((cVar1 == '\x03') && (dVar5 = (this->value_).real_, 0.0 <= dVar5)) {
      dVar6 = 4294967295.0;
      goto LAB_001293a2;
    }
LAB_001293a8:
    bVar3 = cVar1 == '\0';
    break;
  case realValue:
  case booleanValue:
    bVar3 = (byte)*(undefined2 *)&this->bits_;
    if (bVar3 < 6) {
      bVar3 = 0x2f >> (bVar3 & 0x1f);
    }
    else {
      bVar3 = 0;
    }
    break;
  case stringValue:
    bVar3 = (*(ushort *)&this->bits_ & 0xfe) < 6;
    break;
  case arrayValue:
    cVar1 = *(char *)&this->bits_;
    bVar4 = cVar1 == '\x06';
    goto LAB_001293da;
  case objectValue:
    cVar1 = *(char *)&this->bits_;
    bVar4 = cVar1 == '\a';
LAB_001293da:
    bVar3 = cVar1 == '\0' | bVar4;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/external/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x356,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type() == booleanValue && !value_.bool_) ||
           (type() == stringValue && asString().empty()) ||
           (type() == arrayValue && value_.map_->empty()) ||
           (type() == objectValue && value_.map_->empty()) ||
           type() == nullValue;
  case intValue:
    return isInt() ||
           (type() == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type() == booleanValue || type() == nullValue;
  case uintValue:
    return isUInt() ||
           (type() == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type() == booleanValue || type() == nullValue;
  case realValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case booleanValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case stringValue:
    return isNumeric() || type() == booleanValue || type() == stringValue ||
           type() == nullValue;
  case arrayValue:
    return type() == arrayValue || type() == nullValue;
  case objectValue:
    return type() == objectValue || type() == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}